

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O2

void Assimp::Bitmap::WriteData(aiTexture *texture,IOStream *file)

{
  aiTexel *paVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  size_t j;
  ulong uVar5;
  uint8_t pixel [4];
  
  lVar4 = -1;
  for (uVar3 = 0; uVar3 < texture->mHeight; uVar3 = uVar3 + 1) {
    for (uVar5 = 0; uVar5 < texture->mWidth; uVar5 = uVar5 + 1) {
      lVar2 = ((ulong)texture->mHeight + lVar4) * (ulong)texture->mWidth;
      paVar1 = texture->pcData;
      pixel[0] = paVar1[lVar2 + uVar5].r;
      pixel[1] = paVar1[lVar2 + uVar5].g;
      pixel[2] = paVar1[lVar2 + uVar5].b;
      pixel[3] = paVar1[lVar2 + uVar5].a;
      (*file->_vptr_IOStream[3])(file,pixel,4,1);
    }
    (*file->_vptr_IOStream[3])(file,"",0,1);
    lVar4 = lVar4 + -1;
  }
  return;
}

Assistant:

void Bitmap::WriteData(aiTexture* texture, IOStream* file) {
        static const std::size_t padding_offset = 4;
        static const uint8_t padding_data[padding_offset] = {0x0, 0x0, 0x0, 0x0};

        unsigned int padding = (padding_offset - ((mBytesPerPixel * texture->mWidth) % padding_offset)) % padding_offset;
        uint8_t pixel[mBytesPerPixel];

        for(std::size_t i = 0; i < texture->mHeight; ++i) {
            for(std::size_t j = 0; j < texture->mWidth; ++j) {
                const aiTexel& texel = texture->pcData[(texture->mHeight - i - 1) * texture->mWidth + j]; // Bitmap files are stored in bottom-up format

                pixel[0] = texel.r;
                pixel[1] = texel.g;
                pixel[2] = texel.b;
                pixel[3] = texel.a;

                file->Write(pixel, mBytesPerPixel, 1);
            }

            file->Write(padding_data, padding, 1);
        }
    }